

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser_component2ConnectionVariableMissing_Test::~Parser_component2ConnectionVariableMissing_Test
          (Parser_component2ConnectionVariableMissing_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, component2ConnectionVariableMissing)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component_bob\">\n"
        "    <variable name=\"variable_bob\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"component_dave\">\n"
        "    <variable name=\"variable_dave\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_2=\"component_dave\" component_1=\"component_bob\">\n"
        "    <map_variables variable_2=\"variable_angus\" variable_1=\"variable_bob\"/>\n"
        "  </connection>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues = {
        "Variable 'variable_angus' is specified as variable_2 in a connection but it does not exist in component_2 component 'component_dave' of model ''.",
    };

    // Parse
    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in);
    EXPECT_EQ_ISSUES(expectedIssues, p);
}